

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_config
          (App *this,string *option_name,string *default_filename,string *help_message,
          bool config_required)

{
  ulong uVar1;
  Option *pOVar2;
  string local_80;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool config_required_local;
  string *help_message_local;
  string *default_filename_local;
  string *option_name_local;
  App *this_local;
  
  local_29 = config_required;
  psStack_28 = help_message;
  help_message_local = default_filename;
  default_filename_local = option_name;
  option_name_local = (string *)this;
  if (this->config_ptr_ != (Option *)0x0) {
    remove_option(this,this->config_ptr_);
    this->config_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)option_name);
    pOVar2 = add_option<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_50,psStack_28);
    this->config_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_50);
    if ((local_29 & 1) != 0) {
      OptionBase<CLI::Option>::required(&this->config_ptr_->super_OptionBase<CLI::Option>,true);
    }
    uVar1 = ::std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      pOVar2 = this->config_ptr_;
      ::std::__cxx11::string::string((string *)&local_80,(string *)default_filename);
      Option::default_str(pOVar2,&local_80);
      ::std::__cxx11::string::~string((string *)&local_80);
      this->config_ptr_->force_callback_ = true;
    }
    OptionBase<CLI::Option>::configurable(&this->config_ptr_->super_OptionBase<CLI::Option>,false);
    Option::multi_option_policy(this->config_ptr_,Reverse);
  }
  return this->config_ptr_;
}

Assistant:

CLI11_INLINE Option *App::set_config(std::string option_name,
                                     std::string default_filename,
                                     const std::string &help_message,
                                     bool config_required) {

    // Remove existing config if present
    if(config_ptr_ != nullptr) {
        remove_option(config_ptr_);
        config_ptr_ = nullptr;  // need to remove the config_ptr completely
    }

    // Only add config if option passed
    if(!option_name.empty()) {
        config_ptr_ = add_option(option_name, help_message);
        if(config_required) {
            config_ptr_->required();
        }
        if(!default_filename.empty()) {
            config_ptr_->default_str(std::move(default_filename));
            config_ptr_->force_callback_ = true;
        }
        config_ptr_->configurable(false);
        // set the option to take the last value and reverse given by default
        config_ptr_->multi_option_policy(MultiOptionPolicy::Reverse);
    }

    return config_ptr_;
}